

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::setParameters(MidiMessage *this,int p1)

{
  size_type sVar1;
  reference pvVar2;
  int oldsize;
  int p1_local;
  MidiMessage *this_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
  *pvVar2 = (value_type)p1;
  if ((int)sVar1 < 1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
    *pvVar2 = '\0';
  }
  return;
}

Assistant:

void MidiMessage::setParameters(int p1) {
	int oldsize = (int)size();
	resize(2);
	(*this)[1] = (uchar)p1;
	if (oldsize < 1) {
		(*this)[0] = 0;
	}
}